

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::checkForDuplicateFunctions
               (ArrayView<soul::pool_ref<soul::AST::Function>_> functions)

{
  pointer *this;
  bool bVar1;
  size_t __n;
  pool_ref<soul::AST::Function> *ppVar2;
  Function *pFVar3;
  Function *f_00;
  CompileMessage local_b8;
  undefined1 local_80 [8];
  string newSig;
  pool_ref<soul::AST::Function> *f;
  pool_ref<soul::AST::Function> *__end2;
  pool_ref<soul::AST::Function> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::Function>_> *__range2;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  functionSigs;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions_local;
  
  functionSigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)functions.s;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  __n = ArrayView<soul::pool_ref<soul::AST::Function>_>::size
                  ((ArrayView<soul::pool_ref<soul::AST::Function>_> *)
                   &functionSigs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30,__n);
  this = &functionSigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = ArrayView<soul::pool_ref<soul::AST::Function>_>::begin
                     ((ArrayView<soul::pool_ref<soul::AST::Function>_> *)this);
  ppVar2 = ArrayView<soul::pool_ref<soul::AST::Function>_>::end
                     ((ArrayView<soul::pool_ref<soul::AST::Function>_> *)this);
  do {
    if (__end2 == ppVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_30);
      return;
    }
    newSig.field_2._8_8_ = __end2;
    pFVar3 = pool_ref<soul::AST::Function>::operator->(__end2);
    bVar1 = AST::Function::isGeneric(pFVar3);
    if (!bVar1) {
      pFVar3 = pool_ref::operator_cast_to_Function_((pool_ref *)newSig.field_2._8_8_);
      ASTUtilities::getFunctionSignature_abi_cxx11_((string *)local_80,(ASTUtilities *)pFVar3,f_00);
      bVar1 = contains<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_30,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
      if (bVar1) {
        pFVar3 = pool_ref<soul::AST::Function>::operator->
                           ((pool_ref<soul::AST::Function> *)newSig.field_2._8_8_);
        Errors::duplicateFunction<>();
        AST::Context::throwError(&(pFVar3->super_ASTObject).context,&local_b8,false);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_30,(value_type *)local_80);
      std::__cxx11::string::~string((string *)local_80);
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

static void checkForDuplicateFunctions (ArrayView<pool_ref<AST::Function>> functions)
    {
        std::vector<std::string> functionSigs;
        functionSigs.reserve (functions.size());

        for (auto& f : functions)
        {
            if (! f->isGeneric())
            {
                auto newSig = ASTUtilities::getFunctionSignature (f);

                if (contains (functionSigs, newSig))
                    f->context.throwError (Errors::duplicateFunction());

                functionSigs.push_back (newSig);
            }
        }
    }